

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QCalendarWidget::resizeEvent(QCalendarWidget *this,QResizeEvent *event)

{
  QCalendarWidgetPrivate *this_00;
  
  this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (((((this_00->yearEdit->super_QAbstractSpinBox).super_QWidget.data)->widget_attributes & 0x8000
       ) != 0) && (*(int *)(event + 0x10) != *(int *)(event + 0x18))) {
    QCalendarWidgetPrivate::_q_yearEditingFinished(this_00);
  }
  QWidget::resizeEvent(&this->super_QWidget,event);
  return;
}

Assistant:

void QCalendarWidget::resizeEvent(QResizeEvent * event)
{
    Q_D(QCalendarWidget);

    // XXX Should really use a QWidgetStack for yearEdit and yearButton,
    // XXX here we hide the year edit when the layout is likely to break
    // XXX the manual positioning of the yearEdit over the yearButton.
    if (d->yearEdit->isVisible() && event->size().width() != event->oldSize().width())
        d->_q_yearEditingFinished();

    QWidget::resizeEvent(event);
}